

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

SelectorSyntax * __thiscall slang::parsing::Parser::parseElementSelector(Parser *this)

{
  Token range_00;
  Token range_01;
  Token range_02;
  Parser *this_00;
  long lVar1;
  ExpressionSyntax *right;
  long in_RDI;
  Token TVar2;
  Token range_2;
  Token range_1;
  Token range;
  ExpressionSyntax *expr;
  ParserBase *in_stack_ffffffffffffff28;
  Parser *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  SyntaxKind SVar3;
  SyntaxFactory *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  ParserBase *in_stack_ffffffffffffff50;
  undefined2 local_38;
  undefined2 local_20;
  undefined8 local_8;
  
  SVar3 = (SyntaxKind)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  TVar2 = ParserBase::peek(in_stack_ffffffffffffff28);
  local_20 = TVar2.kind;
  if (local_20 == CloseBracket) {
    local_8 = (RangeSelectSyntax *)0x0;
  }
  else {
    this_00 = (Parser *)parseExpression(in_stack_ffffffffffffff30);
    TVar2 = ParserBase::peek(in_stack_ffffffffffffff28);
    local_38 = TVar2.kind;
    if (local_38 == Colon) {
      ParserBase::consume(in_stack_ffffffffffffff50);
      lVar1 = in_RDI + 0xe0;
      parseExpression(in_stack_ffffffffffffff30);
      range_00.info = (Info *)this_00;
      range_00.kind = (short)lVar1;
      range_00._2_1_ = (char)((ulong)lVar1 >> 0x10);
      range_00.numFlags.raw = (char)((ulong)lVar1 >> 0x18);
      range_00.rawLen = (int)((ulong)lVar1 >> 0x20);
      local_8 = slang::syntax::SyntaxFactory::rangeSelect
                          (in_stack_ffffffffffffff40,SVar3,
                           (ExpressionSyntax *)in_stack_ffffffffffffff30,range_00,
                           (ExpressionSyntax *)in_stack_ffffffffffffff28);
    }
    else if (local_38 == PlusColon) {
      ParserBase::consume(in_stack_ffffffffffffff50);
      SVar3 = (SyntaxKind)((ulong)(in_RDI + 0xe0) >> 0x20);
      parseExpression(in_stack_ffffffffffffff30);
      range_01.info = (Info *)in_stack_ffffffffffffff50;
      range_01.kind = (short)in_stack_ffffffffffffff48;
      range_01._2_1_ = (char)((ulong)in_stack_ffffffffffffff48 >> 0x10);
      range_01.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff48 >> 0x18);
      range_01.rawLen = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      local_8 = slang::syntax::SyntaxFactory::rangeSelect
                          ((SyntaxFactory *)this_00,SVar3,
                           (ExpressionSyntax *)in_stack_ffffffffffffff30,range_01,
                           (ExpressionSyntax *)in_stack_ffffffffffffff28);
    }
    else if (local_38 == MinusColon) {
      ParserBase::consume(in_stack_ffffffffffffff50);
      right = (ExpressionSyntax *)(in_RDI + 0xe0);
      parseExpression(this_00);
      range_02.info = (Info *)in_stack_ffffffffffffff50;
      range_02.kind = (short)in_stack_ffffffffffffff48;
      range_02._2_1_ = (char)((ulong)in_stack_ffffffffffffff48 >> 0x10);
      range_02.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff48 >> 0x18);
      range_02.rawLen = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      local_8 = slang::syntax::SyntaxFactory::rangeSelect
                          (in_stack_ffffffffffffff40,SVar3,(ExpressionSyntax *)this_00,range_02,
                           right);
    }
    else {
      local_8 = (RangeSelectSyntax *)
                slang::syntax::SyntaxFactory::bitSelect
                          ((SyntaxFactory *)in_stack_ffffffffffffff30,
                           (ExpressionSyntax *)in_stack_ffffffffffffff28);
    }
  }
  return &local_8->super_SelectorSyntax;
}

Assistant:

SelectorSyntax* Parser::parseElementSelector() {
    if (peek().kind == TokenKind::CloseBracket) {
        return nullptr;
    }
    auto& expr = parseExpression();
    switch (peek().kind) {
        case TokenKind::Colon: {
            auto range = consume();
            return &factory.rangeSelect(SyntaxKind::SimpleRangeSelect, expr, range,
                                        parseExpression());
        }
        case TokenKind::PlusColon: {
            auto range = consume();
            return &factory.rangeSelect(SyntaxKind::AscendingRangeSelect, expr, range,
                                        parseExpression());
        }
        case TokenKind::MinusColon: {
            auto range = consume();
            return &factory.rangeSelect(SyntaxKind::DescendingRangeSelect, expr, range,
                                        parseExpression());
        }
        default:
            return &factory.bitSelect(expr);
    }
}